

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int __thiscall
glslang::TIntermediate::checkLocationRange
          (TIntermediate *this,int set,TIoRange *range,TType *type,bool *typeCollision)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar4;
  pointer pTVar5;
  int *piVar6;
  vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *pvVar7;
  long lVar8;
  _Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *p_Var9;
  
  p_Var9 = &this->usedIo[set].
            super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>;
  pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
  lVar8 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)this->usedIo[set].
                            super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 5);
      uVar4 = uVar4 + 1) {
    bVar1 = TIoRange::overlap(range,(TIoRange *)((long)&(pTVar5->location).start + lVar8));
    pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
    if (bVar1) {
LAB_00302c8d:
      piVar6 = (int *)((long)&(pTVar5->location).start + lVar8);
      goto LAB_00302c90;
    }
    if ((*(int *)((long)&(pTVar5->location).start + lVar8) <= (range->location).last) &&
       ((range->location).start <= *(int *)((long)&(pTVar5->location).last + lVar8))) {
      iVar2 = (*type->_vptr_TType[7])(type);
      pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
      iVar3 = *(int *)((long)&pTVar5->basicType + lVar8);
      if ((((((iVar2 == iVar3) || ((iVar2 == 4 && (iVar3 == 5)))) || ((iVar2 == 5 && (iVar3 == 4))))
           || ((((iVar2 == 6 && (iVar3 == 7)) || ((iVar2 == 7 && (iVar3 == 6)))) ||
               ((iVar2 == 8 && (iVar3 == 9)))))) || ((iVar2 == 9 && (iVar3 == 8)))) ||
         (((iVar2 == 10 && (iVar3 == 0xb)) || ((iVar2 == 0xb && (iVar3 == 10)))))) {
        iVar3 = (*type->_vptr_TType[0xb])(type);
        pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
        if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 8) >> 0x1d & 1) ==
            (uint)(&pTVar5->centroid)[lVar8]) {
          iVar3 = (*type->_vptr_TType[0xb])(type);
          pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
          if ((*(uint *)(CONCAT44(extraout_var_00,iVar3) + 8) >> 0x1e & 1) ==
              (uint)(&pTVar5->smooth)[lVar8]) {
            iVar3 = (*type->_vptr_TType[0xb])(type);
            pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
            if (SUB41((uint)*(undefined4 *)(CONCAT44(extraout_var_01,iVar3) + 8) >> 0x1f,0) ==
                (&pTVar5->flat)[lVar8]) {
              iVar3 = (*type->_vptr_TType[0xb])(type);
              pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
              if (((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 8) >> 0x2d) & 1)
                  == (uint)(&pTVar5->sample)[lVar8]) {
                iVar3 = (*type->_vptr_TType[0xb])(type);
                pTVar5 = (p_Var9->_M_impl).super__Vector_impl_data._M_start;
                if (((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8) >> 0x2c) & 1
                    ) == (uint)(&pTVar5->patch)[lVar8]) goto LAB_00302c79;
              }
            }
          }
        }
      }
      *typeCollision = true;
      goto LAB_00302c8d;
    }
LAB_00302c79:
    lVar8 = lVar8 + 0x20;
  }
  if ((set == 4) || (set == 1)) {
    pvVar7 = this->usedIo + 1;
    if (set != 4) {
      pvVar7 = this->usedIo + 4;
    }
    pTVar5 = (pvVar7->super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar8 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(pvVar7->
                              super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 5);
        uVar4 = uVar4 + 1) {
      if ((*(int *)((long)&(pTVar5->location).start + lVar8) <= (range->location).last) &&
         ((range->location).start <= *(int *)((long)&(pTVar5->location).last + lVar8))) {
        iVar3 = (*type->_vptr_TType[7])(type);
        pTVar5 = (pvVar7->super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar3 != *(int *)((long)&pTVar5->basicType + lVar8)) {
          *typeCollision = true;
          piVar6 = (int *)((long)&(pTVar5->location).start + lVar8);
LAB_00302c90:
          iVar3 = (range->location).start;
          if (iVar3 <= *piVar6) {
            return *piVar6;
          }
          return iVar3;
        }
      }
      lVar8 = lVar8 + 0x20;
    }
  }
  return -1;
}

Assistant:

int TIntermediate::checkLocationRange(int set, const TIoRange& range, const TType& type, bool& typeCollision)
{
    for (size_t r = 0; r < usedIo[set].size(); ++r) {
        if (range.overlap(usedIo[set][r])) {
            // there is a collision; pick one
            return std::max(range.location.start, usedIo[set][r].location.start);
        } else if (range.location.overlap(usedIo[set][r].location) &&
                   (!checkCompatibleTypes(type.getBasicType(), usedIo[set][r].basicType) ||
                    type.getQualifier().centroid != usedIo[set][r].centroid ||
                    type.getQualifier().smooth != usedIo[set][r].smooth ||
                    type.getQualifier().flat != usedIo[set][r].flat ||
                    type.getQualifier().sample != usedIo[set][r].sample ||
                    type.getQualifier().patch != usedIo[set][r].patch)) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[set][r].location.start);
        }
    }

    // check typeCollision between tileImageEXT and out
    if (set == 4 || set == 1) {
      // if the set is "tileImageEXT", check against "out" and vice versa
      int againstSet = (set == 4) ? 1 : 4;
      for (size_t r = 0; r < usedIo[againstSet].size(); ++r) {
        if (range.location.overlap(usedIo[againstSet][r].location) && type.getBasicType() != usedIo[againstSet][r].basicType) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[againstSet][r].location.start);
        }
      }
    }

    return -1; // no collision
}